

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_implicit_tree(lyd_node *tree,uint32_t implicit_options,lyd_node **diff)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  lyd_node **first;
  lyd_node_inner *plVar3;
  lyd_node_inner *node;
  lyd_node_inner *plVar4;
  ly_ht *getnext_ht;
  lyd_node *tree_local;
  ly_set node_when;
  
  node_when.size = 0;
  node_when.count = 0;
  node_when.field_2.dnodes = (lyd_node **)0x0;
  getnext_ht = (ly_ht *)0x0;
  tree_local = tree;
  if (tree == (lyd_node *)0x0) {
    LVar2 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree",
           "lyd_new_implicit_tree");
  }
  else {
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    LVar2 = lyd_val_getnext_ht_new(&getnext_ht);
    if (LVar2 == LY_SUCCESS) {
      node = (lyd_node_inner *)tree;
      while (node != (lyd_node_inner *)0x0) {
        plVar1 = (node->field_0).node.schema;
        if ((plVar1 != (lysc_node *)0x0) && ((plVar1->nodetype & 0x711) != 0)) {
          first = lyd_node_child_p((lyd_node *)node);
          LVar2 = lyd_new_implicit((lyd_node *)node,first,(lysc_node *)0x0,(lys_module *)0x0,
                                   &node_when,(ly_set *)0x0,(ly_set *)0x0,implicit_options,
                                   getnext_ht,diff);
          tree = tree_local;
          if (LVar2 != LY_SUCCESS) goto LAB_0012de71;
        }
        plVar3 = (lyd_node_inner *)lyd_child((lyd_node *)node);
        plVar4 = node;
        if (plVar3 != (lyd_node_inner *)0x0) goto LAB_0012ddf5;
        if (node == (lyd_node_inner *)tree) break;
        do {
          plVar3 = (lyd_node_inner *)(plVar4->field_0).node.next;
LAB_0012ddf5:
          node = plVar3;
        } while ((plVar3 == (lyd_node_inner *)0x0) &&
                (plVar4 = (plVar4->field_0).node.parent,
                (plVar4->field_0).node.parent != (((lyd_node_inner *)tree)->field_0).node.parent));
      }
      LVar2 = lyd_validate_unres(&tree_local,(lys_module *)0x0,LYD_TYPE_DATA_YANG,&node_when,1,
                                 (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,0,diff);
    }
LAB_0012de71:
    ly_set_erase(&node_when,(_func_void_void_ptr *)0x0);
    lyd_val_getnext_ht_free(getnext_ht);
    if ((diff != (lyd_node **)0x0) && (LVar2 != LY_SUCCESS)) {
      lyd_free_all(*diff);
      *diff = (lyd_node *)0x0;
    }
  }
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_tree(struct lyd_node *tree, uint32_t implicit_options, struct lyd_node **diff)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_node *node;
    struct ly_set node_when = {0};
    struct ly_ht *getnext_ht = NULL;

    LY_CHECK_ARG_RET(NULL, tree, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }

    /* create the getnext hash table */
    LY_CHECK_GOTO(rc = lyd_val_getnext_ht_new(&getnext_ht), cleanup);

    LYD_TREE_DFS_BEGIN(tree, node) {
        if (node->schema && (node->schema->nodetype & LYD_NODE_INNER)) {
            LY_CHECK_GOTO(rc = lyd_new_implicit(node, lyd_node_child_p(node), NULL, NULL, &node_when, NULL,
                    NULL, implicit_options, getnext_ht, diff), cleanup);
        }

        LYD_TREE_DFS_END(tree, node);
    }

    /* resolve when and remove any invalid defaults */
    rc = lyd_validate_unres(&tree, NULL, 0, &node_when, LYXP_IGNORE_WHEN, NULL, NULL, NULL, NULL, 0, diff);
    LY_CHECK_GOTO(rc, cleanup);

cleanup:
    ly_set_erase(&node_when, NULL);
    lyd_val_getnext_ht_free(getnext_ht);
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}